

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O2

void __thiscall
copy_on_write<BaseType>::copy_on_write<DerivedType,void>
          (copy_on_write<BaseType> *this,copy_on_write<DerivedType> *c)

{
  __shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<shared_control_block<DerivedType>_> local_30;
  
  (this->cb_).super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ptr_ = (BaseType *)0x0;
  (this->cb_).super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  this->ptr_ = &c->ptr_->super_BaseType;
  std::
  make_shared<delegating_shared_control_block<BaseType,DerivedType>,std::shared_ptr<shared_control_block<DerivedType>>>
            (&local_30);
  std::
  static_pointer_cast<shared_control_block<BaseType>,delegating_shared_control_block<BaseType,DerivedType>>
            ((shared_ptr<delegating_shared_control_block<BaseType,_DerivedType>_> *)&local_40);
  std::__shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->cb_).
              super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>,
             &local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.
              super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  c->ptr_ = (DerivedType *)0x0;
  return;
}

Assistant:

copy_on_write(copy_on_write<U>&& c)
  {
    ptr_ = c.ptr_;
    cb_ = std::static_pointer_cast<shared_control_block<T>>(
        std::make_shared<delegating_shared_control_block<T, U>>(
            std::move(c.cb_)));
    c.ptr_ = nullptr;
  }